

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStream.cpp
# Opt level: O1

void __thiscall DIS::DataStream::DoRead(DataStream *this,char *ch,size_t bufsize)

{
  pointer pcVar1;
  ulong uVar2;
  ulong uVar3;
  char *this_00;
  ulong uVar4;
  ulong uVar5;
  char cStack_11;
  
  if (bufsize != 0) {
    uVar2 = 1;
    uVar5 = 0;
    do {
      uVar4 = uVar2;
      uVar2 = this->_read_pos + uVar5;
      pcVar1 = (this->_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar3 = (long)(this->_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pcVar1;
      if (uVar3 <= uVar2) {
        this_00 = "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)";
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar2
                   ,uVar3);
        cStack_11 = (char)uVar2;
        DoWrite((DataStream *)this_00,&cStack_11,1);
        ((DataStream *)this_00)->_write_pos = ((DataStream *)this_00)->_write_pos + 1;
        return;
      }
      ch[uVar5] = pcVar1[uVar2];
      uVar2 = (ulong)((int)uVar4 + 1);
      uVar5 = uVar4;
    } while (uVar4 < bufsize);
  }
  return;
}

Assistant:

void DataStream::DoRead(char* ch, size_t bufsize)
{
   for(unsigned int i=0; i<bufsize; i++)
   {
      ch[i] = _buffer.at(_read_pos+i);
   }
}